

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O1

FT_Long PS_Conv_Strtol(FT_Byte **cursor,FT_Byte *limit,FT_Long base)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  pbVar7 = *cursor;
  if (base - 0x25U < 0xffffffffffffffdd || limit <= pbVar7) {
    return 0;
  }
  bVar1 = *pbVar7;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    pbVar7 = pbVar7 + 1;
    if (pbVar7 == limit) {
      return 0;
    }
    bVar12 = bVar1 == 0x2d;
    if (*pbVar7 == 0x2b) {
      return 0;
    }
    if (*pbVar7 == 0x2d) {
      return 0;
    }
  }
  else {
    bVar12 = false;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = base;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff);
  lVar6 = SUB168(auVar3 / auVar2,0);
  lVar10 = 0;
  if (pbVar7 < limit) {
    lVar10 = (long)limit - (long)pbVar7;
    lVar9 = 0;
    bVar5 = false;
    pbVar8 = pbVar7;
    do {
      uVar11 = (ulong)*pbVar8;
      if ((((uVar11 < 0x21) && ((0x100003601U >> (uVar11 & 0x3f) & 1) != 0)) ||
          ((char)*pbVar8 < '\0')) ||
         ((uVar11 = (ulong)ft_char_table[uVar11], (long)uVar11 < 0 || (base <= (long)uVar11)))) {
        bVar4 = false;
      }
      else if ((lVar6 < lVar9) ||
              ((bVar4 = true, lVar9 == lVar6 && (SUB168(auVar3 % auVar2,0) < uVar11)))) {
        bVar4 = true;
        bVar5 = true;
      }
      else {
        lVar9 = lVar9 * base + uVar11;
      }
      pbVar7 = pbVar8;
      if (!bVar4) break;
      pbVar8 = pbVar8 + 1;
      lVar10 = lVar10 + -1;
      pbVar7 = limit;
    } while (lVar10 != 0);
    lVar10 = 0x7fffffff;
    if (!bVar5) {
      lVar10 = lVar9;
    }
  }
  *cursor = pbVar7;
  lVar6 = -lVar10;
  if (!bVar12) {
    lVar6 = lVar10;
  }
  return lVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  PS_Conv_Strtol( FT_Byte**  cursor,
                  FT_Byte*   limit,
                  FT_Long    base )
  {
    FT_Byte*  p = *cursor;

    FT_Long   num           = 0;
    FT_Bool   sign          = 0;
    FT_Bool   have_overflow = 0;

    FT_Long   num_limit;
    FT_Char   c_limit;


    if ( p >= limit )
      goto Bad;

    if ( base < 2 || base > 36 )
    {
      FT_TRACE4(( "!!!INVALID BASE:!!!" ));
      return 0;
    }

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    num_limit = 0x7FFFFFFFL / base;
    c_limit   = (FT_Char)( 0x7FFFFFFFL % base );

    for ( ; p < limit; p++ )
    {
      FT_Char  c;


      if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
        break;

      c = ft_char_table[*p & 0x7F];

      if ( c < 0 || c >= base )
        break;

      if ( num > num_limit || ( num == num_limit && c > c_limit ) )
        have_overflow = 1;
      else
        num = num * base + c;
    }

    *cursor = p;

    if ( have_overflow )
    {
      num = 0x7FFFFFFFL;
      FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    }

    if ( sign )
      num = -num;

    return num;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;
  }